

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O0

void u64To(void *dest,size_t count,u64 *src)

{
  void *in_RDX;
  void *in_RSI;
  
  memMove(in_RSI,in_RDX,0x11ef45);
  return;
}

Assistant:

void u64To(void* dest, size_t count, const u64 src[])
{
	ASSERT(memIsValid(src, (count + 7) / 8 * 8));
	ASSERT(memIsValid(dest, count));
	memMove(dest, src, count);
#if (OCTET_ORDER == BIG_ENDIAN)
	if (count % 8)
	{
		size_t t = count / 8;
		register u64 u = src[t];
		for (t *= 8; t < count; ++t, u >>= 8)
			((octet*)dest)[t] = (octet)u;
	}
	for (count /= 8; count--;)
		((u64*)dest)[count] = u64Rev(((u64*)dest)[count]);
#endif // OCTET_ORDER
}